

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenBinarySetRight(BinaryenExpressionRef expr,BinaryenExpressionRef rightExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef rightExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Binary>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Binary>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xb3b,"void BinaryenBinarySetRight(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (rightExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = rightExpr;
    return;
  }
  __assert_fail("rightExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xb3c,"void BinaryenBinarySetRight(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenBinarySetRight(BinaryenExpressionRef expr,
                            BinaryenExpressionRef rightExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Binary>());
  assert(rightExpr);
  static_cast<Binary*>(expression)->right = (Expression*)rightExpr;
}